

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# number_mapper.cpp
# Opt level: O3

void __thiscall
icu_63::number::impl::PropertiesAffixPatternProvider::setTo
          (PropertiesAffixPatternProvider *this,DecimalFormatProperties *properties,
          UErrorCode *param_2)

{
  ushort uVar1;
  UnicodeString *__return_storage_ptr__;
  UnicodeString *pUVar2;
  UnicodeString *__return_storage_ptr___00;
  UnicodeString nso;
  UnicodeString npo;
  UnicodeString pso;
  UnicodeString ppo;
  UnicodeString local_1b0;
  UnicodeString local_170;
  UnicodeString local_130;
  UnicodeString local_f0;
  UnicodeString local_b0;
  UnicodeString local_70;
  
  this->fBogus = false;
  AffixUtils::escape(&local_70,&properties->positivePrefix);
  AffixUtils::escape(&local_b0,&properties->positiveSuffix);
  __return_storage_ptr__ = &local_f0;
  AffixUtils::escape(__return_storage_ptr__,&properties->negativePrefix);
  __return_storage_ptr___00 = &local_130;
  AffixUtils::escape(__return_storage_ptr___00,&properties->negativeSuffix);
  pUVar2 = &local_70;
  if (((undefined1  [56])
       ((undefined1  [56])(properties->positivePrefix).fUnion & (undefined1  [56])0x1) ==
       (undefined1  [56])0x0) ||
     (pUVar2 = &properties->positivePrefixPattern,
     (undefined1  [56])
     ((undefined1  [56])(properties->positivePrefixPattern).fUnion & (undefined1  [56])0x1) ==
     (undefined1  [56])0x0)) {
    UnicodeString::operator=(&this->posPrefix,pUVar2);
  }
  else {
    UnicodeString::UnicodeString(&local_1b0,L"");
    UnicodeString::moveFrom(&this->posPrefix,&local_1b0);
    UnicodeString::~UnicodeString(&local_1b0);
  }
  pUVar2 = &local_b0;
  if (((undefined1  [56])
       ((undefined1  [56])(properties->positiveSuffix).fUnion & (undefined1  [56])0x1) ==
       (undefined1  [56])0x0) ||
     (pUVar2 = &properties->positiveSuffixPattern,
     (undefined1  [56])
     ((undefined1  [56])(properties->positiveSuffixPattern).fUnion & (undefined1  [56])0x1) ==
     (undefined1  [56])0x0)) {
    UnicodeString::operator=(&this->posSuffix,pUVar2);
  }
  else {
    UnicodeString::UnicodeString(&local_1b0,L"");
    UnicodeString::moveFrom(&this->posSuffix,&local_1b0);
    UnicodeString::~UnicodeString(&local_1b0);
  }
  if ((undefined1  [56])
      ((undefined1  [56])(properties->negativePrefix).fUnion & (undefined1  [56])0x1) ==
      (undefined1  [56])0x0) {
LAB_00261730:
    UnicodeString::operator=(&this->negPrefix,__return_storage_ptr__);
  }
  else {
    if ((undefined1  [56])
        ((undefined1  [56])(properties->negativePrefixPattern).fUnion & (undefined1  [56])0x1) ==
        (undefined1  [56])0x0) {
      __return_storage_ptr__ = &properties->negativePrefixPattern;
      goto LAB_00261730;
    }
    uVar1 = (properties->positivePrefixPattern).fUnion.fStackFields.fLengthAndFlags;
    if ((uVar1 & 1) == 0) {
      UnicodeString::UnicodeString(&local_170,L"-");
      operator+(&local_1b0,&local_170,&properties->positivePrefixPattern);
    }
    else {
      UnicodeString::UnicodeString(&local_1b0,L"-");
    }
    UnicodeString::moveFrom(&this->negPrefix,&local_1b0);
    UnicodeString::~UnicodeString(&local_1b0);
    if ((uVar1 & 1) == 0) {
      UnicodeString::~UnicodeString(&local_170);
    }
  }
  if ((undefined1  [56])
      ((undefined1  [56])(properties->negativeSuffix).fUnion & (undefined1  [56])0x1) !=
      (undefined1  [56])0x0) {
    if ((undefined1  [56])
        ((undefined1  [56])(properties->negativeSuffixPattern).fUnion & (undefined1  [56])0x1) !=
        (undefined1  [56])0x0) {
      if ((undefined1  [56])
          ((undefined1  [56])(properties->positiveSuffixPattern).fUnion & (undefined1  [56])0x1) ==
          (undefined1  [56])0x0) {
        UnicodeString::UnicodeString(&local_1b0,&properties->positiveSuffixPattern);
      }
      else {
        UnicodeString::UnicodeString(&local_1b0,L"");
      }
      UnicodeString::operator=(&this->negSuffix,&local_1b0);
      UnicodeString::~UnicodeString(&local_1b0);
      goto LAB_00261836;
    }
    __return_storage_ptr___00 = &properties->negativeSuffixPattern;
  }
  UnicodeString::operator=(&this->negSuffix,__return_storage_ptr___00);
LAB_00261836:
  UnicodeString::~UnicodeString(&local_130);
  UnicodeString::~UnicodeString(&local_f0);
  UnicodeString::~UnicodeString(&local_b0);
  UnicodeString::~UnicodeString(&local_70);
  return;
}

Assistant:

void PropertiesAffixPatternProvider::setTo(const DecimalFormatProperties& properties, UErrorCode&) {
    fBogus = false;

    // There are two ways to set affixes in DecimalFormat: via the pattern string (applyPattern), and via the
    // explicit setters (setPositivePrefix and friends).  The way to resolve the settings is as follows:
    //
    // 1) If the explicit setting is present for the field, use it.
    // 2) Otherwise, follows UTS 35 rules based on the pattern string.
    //
    // Importantly, the explicit setters affect only the one field they override.  If you set the positive
    // prefix, that should not affect the negative prefix.  Since it is impossible for the user of this class
    // to know whether the origin for a string was the override or the pattern, we have to say that we always
    // have a negative subpattern and perform all resolution logic here.

    // Convenience: Extract the properties into local variables.
    // Variables are named with three chars: [p/n][p/s][o/p]
    // [p/n] => p for positive, n for negative
    // [p/s] => p for prefix, s for suffix
    // [o/p] => o for escaped custom override string, p for pattern string
    UnicodeString ppo = AffixUtils::escape(properties.positivePrefix);
    UnicodeString pso = AffixUtils::escape(properties.positiveSuffix);
    UnicodeString npo = AffixUtils::escape(properties.negativePrefix);
    UnicodeString nso = AffixUtils::escape(properties.negativeSuffix);
    const UnicodeString& ppp = properties.positivePrefixPattern;
    const UnicodeString& psp = properties.positiveSuffixPattern;
    const UnicodeString& npp = properties.negativePrefixPattern;
    const UnicodeString& nsp = properties.negativeSuffixPattern;

    if (!properties.positivePrefix.isBogus()) {
        posPrefix = ppo;
    } else if (!ppp.isBogus()) {
        posPrefix = ppp;
    } else {
        // UTS 35: Default positive prefix is empty string.
        posPrefix = u"";
    }

    if (!properties.positiveSuffix.isBogus()) {
        posSuffix = pso;
    } else if (!psp.isBogus()) {
        posSuffix = psp;
    } else {
        // UTS 35: Default positive suffix is empty string.
        posSuffix = u"";
    }

    if (!properties.negativePrefix.isBogus()) {
        negPrefix = npo;
    } else if (!npp.isBogus()) {
        negPrefix = npp;
    } else {
        // UTS 35: Default negative prefix is "-" with positive prefix.
        // Important: We prepend the "-" to the pattern, not the override!
        negPrefix = ppp.isBogus() ? u"-" : u"-" + ppp;
    }

    if (!properties.negativeSuffix.isBogus()) {
        negSuffix = nso;
    } else if (!nsp.isBogus()) {
        negSuffix = nsp;
    } else {
        // UTS 35: Default negative prefix is the positive prefix.
        negSuffix = psp.isBogus() ? u"" : psp;
    }
}